

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandListVkImpl.hpp
# Opt level: O2

void __thiscall
Diligent::CommandListVkImpl::CommandListVkImpl
          (CommandListVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          DeviceContextVkImpl *pDeferredCtx,VkCommandBuffer vkCmdBuff)

{
  CommandListBase<Diligent::EngineVkImplTraits>::CommandListBase
            (&this->super_CommandListBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,
             pDeferredCtx,false);
  (this->super_CommandListBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
  .super_ObjectBase<Diligent::ICommandList>.super_RefCountedObject<Diligent::ICommandList>.
  super_ICommandList.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00a55210;
  RefCntAutoPtr<Diligent::IDeviceContext>::RefCntAutoPtr
            (&this->m_pDeferredCtx,(IDeviceContext *)pDeferredCtx);
  this->m_vkCmdBuff = vkCmdBuff;
  return;
}

Assistant:

CommandListVkImpl(IReferenceCounters*  pRefCounters,
                      RenderDeviceVkImpl*  pDevice,
                      DeviceContextVkImpl* pDeferredCtx,
                      VkCommandBuffer      vkCmdBuff) :
        // clang-format off
        TCommandListBase {pRefCounters, pDevice, pDeferredCtx},
        m_pDeferredCtx   {pDeferredCtx},
        m_vkCmdBuff      {vkCmdBuff   }
    // clang-format on
    {
    }